

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_INT *pRVar7;
  bool bVar8;
  bool bVar9;
  REF_STATUS RVar10;
  uint uVar11;
  REF_CELL *ppRVar12;
  undefined8 uVar13;
  REF_INT RVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  REF_INT cell0;
  REF_INT cell1;
  REF_INT face_nodes [4];
  REF_INT nodes [27];
  REF_STATUS local_f4;
  REF_STATUS local_f0;
  int local_e8;
  int local_e4;
  long local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  REF_CELL local_c8;
  REF_CELL local_c0;
  REF_CELL *local_b8;
  REF_CELL *local_b0;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  
  local_b8 = ref_grid->cell;
  local_c0 = ref_grid->cell[6];
  local_f4 = local_f0;
  if (0 < ref_grid->cell[3]->max) {
    local_b0 = ref_grid->cell + 8;
    RVar14 = 0;
    local_c8 = ref_grid->cell[3];
    do {
      RVar10 = ref_cell_nodes(local_c8,RVar14,&local_a8);
      if (RVar10 == 0) {
        local_d8 = CONCAT44(iStack_a4,local_a8);
        uStack_d0 = CONCAT44(local_a8,iStack_a0);
        bVar8 = false;
        local_e0 = 8;
        ppRVar12 = local_b0;
        do {
          pRVar5 = *ppRVar12;
          uVar11 = ref_cell_with_face(pRVar5,(REF_INT *)&local_d8,&local_e8,&local_e4);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x2a0,"ref_grid_inward_boundary_orientation",(ulong)uVar11,"with face");
            return uVar11;
          }
          if (local_e8 != -1) {
            if (local_e4 != -1) {
              printf("group %d cell0 %d cell1 %d\n",local_e0);
              if (0 < pRVar5->node_per) {
                uVar17 = 0;
                do {
                  pRVar4 = ref_grid->node->real;
                  lVar18 = (long)pRVar5->c2n[(long)local_e8 * (long)pRVar5->size_per + uVar17];
                  printf("cell0 node %d xyz %f %f %f\n",SUB84(pRVar4[lVar18 * 0xf],0),
                         pRVar4[lVar18 * 0xf + 1],pRVar4[lVar18 * 0xf + 2],uVar17 & 0xffffffff);
                  uVar17 = uVar17 + 1;
                } while ((int)uVar17 < pRVar5->node_per);
              }
              if (0 < pRVar5->node_per) {
                uVar17 = 0;
                do {
                  pRVar4 = ref_grid->node->real;
                  lVar18 = (long)pRVar5->c2n[(long)local_e4 * (long)pRVar5->size_per + uVar17];
                  printf("cell1 node %d xyz %f %f %f\n",SUB84(pRVar4[lVar18 * 0xf],0),
                         pRVar4[lVar18 * 0xf + 1],pRVar4[lVar18 * 0xf + 2],uVar17 & 0xffffffff);
                  uVar17 = uVar17 + 1;
                } while ((int)uVar17 < pRVar5->node_per);
              }
              uVar17 = 0;
              do {
                pRVar4 = ref_grid->node->real;
                lVar18 = (long)*(int *)((long)&local_d8 + uVar17 * 4);
                printf("face node %d xyz %f %f %f\n",SUB84(pRVar4[lVar18 * 0xf],0),
                       pRVar4[lVar18 * 0xf + 1],pRVar4[lVar18 * 0xf + 2],uVar17 & 0xffffffff);
                iVar1 = local_e4;
                uVar17 = uVar17 + 1;
              } while (uVar17 != 3);
              if ((long)local_e4 != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x2be,"ref_grid_inward_boundary_orientation",
                       "boundary triangle with two cells",0xffffffffffffffff,(long)local_e4);
                local_f4 = 1;
              }
              if (iVar1 != -1) {
                return local_f4;
              }
            }
            if (0 < (long)pRVar5->face_per) {
              pRVar6 = pRVar5->f2n;
              pRVar7 = pRVar5->c2n;
              lVar18 = (long)local_e8 * (long)pRVar5->size_per;
              lVar15 = 0;
              do {
                iVar1 = pRVar7[*(int *)((long)pRVar6 + lVar15) + lVar18];
                lVar16 = (long)(int)lVar18;
                bVar9 = bVar8;
                if ((iVar1 == pRVar7[*(int *)((long)pRVar6 + lVar15 + 0xc) + lVar16]) &&
                   (((((iVar2 = pRVar7[*(int *)((long)pRVar6 + lVar15 + 4) + lVar16],
                       local_a8 == iVar2 && (iStack_a4 == iVar1)) &&
                      (iStack_a0 == pRVar7[*(int *)((long)pRVar6 + lVar15 + 8) + lVar16])) ||
                     ((((iStack_a4 == iVar2 && (iStack_a0 == iVar1)) &&
                       (local_a8 == pRVar7[*(int *)((long)pRVar6 + lVar15 + 8) + lVar16])) ||
                      (((local_a8 == iVar1 && (iStack_a0 == iVar2)) &&
                       (iStack_a4 == pRVar7[*(int *)((long)pRVar6 + lVar15 + 8) + lVar16])))))) &&
                    (bVar9 = true, bVar8)))) {
                  uVar13 = 0x2cd;
                  goto LAB_0015c6b6;
                }
                bVar8 = bVar9;
                lVar15 = lVar15 + 0x10;
              } while ((long)pRVar5->face_per * 0x10 != lVar15);
            }
          }
          ppRVar12 = local_b8 + local_e0 + 1;
          local_e0 = local_e0 + 1;
        } while (local_e0 != 0x10);
        if (bVar8) {
          local_a8 = (int)uStack_d0;
          iStack_a4 = (int)((ulong)local_d8 >> 0x20);
          iStack_a0 = (int)local_d8;
          uVar11 = ref_cell_replace_whole(local_c8,RVar14,&local_a8);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x2d6,"ref_grid_inward_boundary_orientation",(ulong)uVar11,"replace with flip");
            return uVar11;
          }
        }
      }
      RVar14 = RVar14 + 1;
    } while (RVar14 < local_c8->max);
  }
  if (0 < local_c0->max) {
    RVar14 = 0;
    do {
      RVar10 = ref_cell_nodes(local_c0,RVar14,&local_a8);
      if (RVar10 == 0) {
        local_c8 = (REF_CELL)CONCAT44(local_c8._4_4_,RVar14);
        local_d8 = CONCAT44(iStack_a4,local_a8);
        uStack_d0 = CONCAT44(iStack_9c,iStack_a0);
        bVar8 = false;
        lVar18 = 8;
        ppRVar12 = ref_grid->cell + 8;
        do {
          pRVar5 = *ppRVar12;
          uVar11 = ref_cell_with_face(pRVar5,(REF_INT *)&local_d8,&local_e8,&local_e4);
          iVar1 = local_e4;
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x2de,"ref_grid_inward_boundary_orientation",(ulong)uVar11,"wf");
            return uVar11;
          }
          if (local_e8 != -1) {
            if ((long)local_e4 != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2e0,"ref_grid_inward_boundary_orientation","boundary quad with two cells",
                     0xffffffffffffffff,(long)local_e4);
              local_f4 = 1;
            }
            if (iVar1 != -1) {
              return local_f4;
            }
            if (0 < (long)pRVar5->face_per) {
              pRVar6 = pRVar5->f2n;
              pRVar7 = pRVar5->c2n;
              lVar15 = (long)local_e8 * (long)pRVar5->size_per;
              local_e0 = CONCAT44(local_e0._4_4_,iStack_9c);
              lVar16 = 0;
              do {
                iVar1 = pRVar7[*(int *)((long)pRVar6 + lVar16) + lVar15];
                lVar19 = (long)(int)lVar15;
                iVar2 = pRVar7[*(int *)((long)pRVar6 + lVar16 + 0xc) + lVar19];
                bVar9 = bVar8;
                if ((iVar1 != iVar2) &&
                   ((((((local_a8 == iVar2 &&
                        (iStack_a4 == pRVar7[*(int *)((long)pRVar6 + lVar16 + 8) + lVar19])) &&
                       (iStack_a0 == pRVar7[*(int *)((long)pRVar6 + lVar16 + 4) + lVar19])) &&
                      (iStack_9c == iVar1)) ||
                     ((((iVar3 = pRVar7[*(int *)((long)pRVar6 + lVar16 + 8) + lVar19],
                        local_a8 == iVar3 &&
                        (iStack_a4 == pRVar7[*(int *)((long)pRVar6 + lVar16 + 4) + lVar19])) &&
                       ((iStack_a0 == iVar1 && (iStack_9c == iVar2)))) ||
                      (((((local_a8 == pRVar7[*(int *)((long)pRVar6 + lVar16 + 4) + lVar19] &&
                          (iStack_a4 == iVar1)) && (iStack_a0 == iVar2)) && (iStack_9c == iVar3)) ||
                       ((((local_a8 == iVar1 && (iStack_a4 == iVar2)) && (iStack_a0 == iVar3)) &&
                        (iStack_9c == pRVar7[*(int *)((long)pRVar6 + lVar16 + 4) + lVar19]))))))))
                    && (bVar9 = true, bVar8)))) {
                  uVar13 = 0x2f5;
LAB_0015c6b6:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,uVar13,"ref_grid_inward_boundary_orientation","error, flip set twice");
                  return 1;
                }
                bVar8 = bVar9;
                lVar16 = lVar16 + 0x10;
              } while ((long)pRVar5->face_per * 0x10 != lVar16);
            }
          }
          ppRVar12 = local_b8 + lVar18 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        RVar14 = (REF_INT)local_c8;
        if (bVar8) {
          local_a8 = (int)((ulong)uStack_d0 >> 0x20);
          iStack_a4 = (int)uStack_d0;
          iStack_a0 = (int)((ulong)local_d8 >> 0x20);
          iStack_9c = (int)local_d8;
          uVar11 = ref_cell_replace_whole(local_c0,(REF_INT)local_c8,&local_a8);
          if (uVar11 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x2ff,"ref_grid_inward_boundary_orientation",(ulong)uVar11,"replace with flip");
            return uVar11;
          }
        }
      }
      RVar14 = RVar14 + 1;
    } while (RVar14 < local_c0->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, cell0, cell1;
  REF_INT node;
  REF_INT face_nodes[4];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL flip;
  REF_INT face, group;

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    for (node = 0; node < 3; node++) face_nodes[node] = nodes[node];
    face_nodes[3] = face_nodes[0];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
          "with face");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      if (REF_EMPTY != cell1) {
        printf("group %d cell0 %d cell1 %d\n", group, cell0, cell1);
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell0 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell0)));
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell1 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell1)));
        }
        for (node = 0; node < 3; node++) {
          printf("face node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 1, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 2, face_nodes[node]));
        }
        /* RSS( ref_export_by_extension( ref_grid,
           "bc-flip-debug.tec" ), "ex tec"); */
        REIS(REF_EMPTY, cell1, "boundary triangle with two cells");
      }
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) !=
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip quad faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[2];
      nodes[1] = face_nodes[1];
      nodes[2] = face_nodes[0];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "replace with flip");
    }
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, nodes) {
    for (node = 0; node < 4; node++) face_nodes[node] = nodes[node];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "wf");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      REIS(REF_EMPTY, cell1, "boundary quad with two cells");
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) ==
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip tri faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 0, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 3, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 1, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[3];
      nodes[1] = face_nodes[2];
      nodes[2] = face_nodes[1];
      nodes[3] = face_nodes[0];
      RSS(ref_cell_replace_whole(qua, cell, nodes), "replace with flip");
    }
  }

  return REF_SUCCESS;
}